

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initFactorMatrix(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         **vec,
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  fpclass_type *pfVar1;
  U *pUVar2;
  Col *pCVar3;
  Dring *pDVar4;
  Dring *pDVar5;
  fpclass_type fVar6;
  uint uVar7;
  int p_row;
  fpclass_type fVar8;
  fpclass_type fVar9;
  fpclass_type fVar10;
  int *piVar11;
  int *piVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  Dring *pDVar14;
  Dring *pDVar15;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  int32_t iVar17;
  int32_t iVar18;
  int32_t iVar19;
  bool bVar20;
  byte bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  byte bVar24;
  int iVar25;
  int iVar26;
  long_long_type lVar27;
  undefined8 *puVar28;
  uint *puVar29;
  pointer pnVar30;
  uint uVar31;
  long lVar32;
  int iVar33;
  uint uVar34;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar35;
  uint *puVar36;
  cpp_dec_float<200U,_int,_void> *pcVar37;
  uint *puVar38;
  long lVar39;
  long lVar40;
  Dring *pDVar41;
  Dring *pDVar42;
  byte bVar43;
  ulong i;
  long lVar44;
  byte bVar45;
  cpp_dec_float<200U,_int,_void> vv;
  int local_51c;
  cpp_dec_float<200U,_int,_void> local_508;
  uint *local_488;
  cpp_dec_float<200U,_int,_void> *local_480;
  int *local_478;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **local_470;
  undefined1 local_468 [32];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [13];
  undefined3 uStack_3fb;
  int iStack_3f8;
  bool bStack_3f4;
  undefined8 local_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 auStack_398 [12];
  undefined4 local_38c;
  undefined1 auStack_388 [12];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_37c;
  cpp_dec_float<200U,_int,_void> local_2fc;
  cpp_dec_float<200U,_int,_void> local_27c;
  cpp_dec_float<200U,_int,_void> local_1fc;
  uint local_17c [27];
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar45 = 0;
  auStack_388 = SUB1612((undefined1  [16])0x0,4);
  auStack_398 = SUB1612((undefined1  [16])0x0,0);
  local_38c = 0;
  local_3a8 = (undefined1  [16])0x0;
  local_3b8 = (undefined1  [16])0x0;
  local_3c8 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_478 = (this->temp).s_mark;
  if (0 < this->thedim) {
    piVar11 = (this->u).row.len;
    piVar12 = (this->u).row.max;
    lVar39 = 0;
    do {
      piVar11[lVar39] = 0;
      piVar12[lVar39] = 0;
      lVar39 = lVar39 + 1;
    } while (lVar39 < this->thedim);
  }
  i = 0;
  if (0 < this->thedim) {
    piVar11 = (this->u).row.max;
    lVar39 = 0;
    do {
      iVar33 = vec[lVar39]->memused;
      if ((long)iVar33 < 2) {
        if (iVar33 == 0) {
          this->stat = SINGULAR;
          return;
        }
      }
      else {
        pNVar13 = vec[lVar39]->m_elem;
        lVar40 = 0;
        do {
          piVar12 = piVar11 + *(int *)((long)(&pNVar13->val + 1) + lVar40);
          *piVar12 = *piVar12 + 1;
          lVar40 = lVar40 + 0x84;
        } while ((long)iVar33 * 0x84 != lVar40);
        i = (ulong)(uint)(iVar33 + (int)i);
      }
      lVar39 = lVar39 + 1;
    } while (lVar39 < this->thedim);
    i = (ulong)(int)i;
  }
  local_3f0._0_4_ = cpp_dec_float_finite;
  local_3f0._4_4_ = 0x1c;
  local_468._0_16_ = (undefined1  [16])0x0;
  local_468._16_16_ = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = SUB1613((undefined1  [16])0x0,0);
  uStack_3fb = 0;
  iStack_3f8 = 0;
  bStack_3f4 = false;
  local_470 = vec;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_508,i,(type *)0x0);
  if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)local_468 != &this->rowMemMult) {
    pnVar35 = &this->rowMemMult;
    puVar36 = (uint *)local_468;
    for (lVar39 = 0x1c; lVar39 != 0; lVar39 = lVar39 + -1) {
      *puVar36 = (pnVar35->m_backend).data._M_elems[0];
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + (ulong)bVar45 * -8 + 4);
      puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
    }
    iStack_3f8 = (this->rowMemMult).m_backend.exp;
    bStack_3f4 = (this->rowMemMult).m_backend.neg;
    local_3f0._0_4_ = (this->rowMemMult).m_backend.fpclass;
    local_3f0._4_4_ = (this->rowMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_468,&local_508);
  lVar39 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<200U,_int,_void> *)local_468);
  if (lVar39 < -0x7fffffff) {
    lVar39 = -0x80000000;
  }
  if (0x7ffffffe < lVar39) {
    lVar39 = 0x7fffffff;
  }
  minRowMem(this,(int)lVar39);
  local_3f0._0_4_ = cpp_dec_float_finite;
  local_3f0._4_4_ = 0x1c;
  local_468._0_16_ = (undefined1  [16])0x0;
  local_468._16_16_ = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = SUB1613((undefined1  [16])0x0,0);
  uStack_3fb = 0;
  iStack_3f8 = 0;
  bStack_3f4 = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_508,i,(type *)0x0);
  if ((cpp_dec_float<200U,_int,_void> *)local_468 != &(this->colMemMult).m_backend) {
    pnVar35 = &this->colMemMult;
    puVar36 = (uint *)local_468;
    for (lVar39 = 0x1c; lVar39 != 0; lVar39 = lVar39 + -1) {
      *puVar36 = (pnVar35->m_backend).data._M_elems[0];
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + (ulong)bVar45 * -8 + 4);
      puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
    }
    iStack_3f8 = (this->colMemMult).m_backend.exp;
    bStack_3f4 = (this->colMemMult).m_backend.neg;
    local_3f0._0_4_ = (this->colMemMult).m_backend.fpclass;
    local_3f0._4_4_ = (this->colMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_468,&local_508);
  lVar27 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<200U,_int,_void> *)local_468);
  lVar39 = -0x80000000;
  if (-0x80000000 < lVar27) {
    lVar39 = lVar27;
  }
  if (0x7ffffffe < lVar39) {
    lVar39 = 0x7fffffff;
  }
  iVar33 = (int)lVar39;
  if ((this->u).col.size < iVar33) {
    (this->u).col.size = iVar33;
    spx_realloc<int*>(&(this->u).col.idx,iVar33);
  }
  local_3f0._0_4_ = cpp_dec_float_finite;
  local_3f0._4_4_ = 0x1c;
  local_468._0_16_ = (undefined1  [16])0x0;
  local_468._16_16_ = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = SUB1613((undefined1  [16])0x0,0);
  uStack_3fb = 0;
  iStack_3f8 = 0;
  bStack_3f4 = false;
  iVar33 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_508,i,(type *)0x0);
  if ((cpp_dec_float<200U,_int,_void> *)local_468 != &(this->lMemMult).m_backend) {
    pnVar35 = &this->lMemMult;
    puVar36 = (uint *)local_468;
    for (lVar39 = 0x1c; lVar39 != 0; lVar39 = lVar39 + -1) {
      *puVar36 = (pnVar35->m_backend).data._M_elems[0];
      pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar35 + (ulong)bVar45 * -8 + 4);
      puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
    }
    iStack_3f8 = (this->lMemMult).m_backend.exp;
    bStack_3f4 = (this->lMemMult).m_backend.neg;
    local_3f0._0_4_ = (this->lMemMult).m_backend.fpclass;
    local_3f0._4_4_ = (this->lMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_468,&local_508);
  lVar27 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<200U,_int,_void> *)local_468);
  lVar39 = -0x80000000;
  if (-0x80000000 < lVar27) {
    lVar39 = lVar27;
  }
  if (0x7ffffffe < lVar39) {
    lVar39 = 0x7fffffff;
  }
  minLMem(this,(int)lVar39);
  pUVar2 = &this->u;
  piVar11 = (this->u).row.start;
  *piVar11 = 0;
  pDVar14 = (this->u).row.elem;
  iVar25 = this->thedim;
  (this->u).row.list.idx = iVar25;
  (this->u).row.list.next = pDVar14;
  pCVar3 = &(this->u).col;
  pDVar15 = (this->u).col.elem;
  (this->u).col.list.idx = iVar25;
  (this->u).col.list.next = pDVar15;
  pDVar41 = &pCVar3->list;
  pDVar42 = (Dring *)pUVar2;
  if (0 < iVar25) {
    piVar12 = (this->u).row.max;
    lVar40 = 0;
    iVar33 = 0;
    lVar39 = 0;
    pDVar41 = (Dring *)pUVar2;
    pDVar42 = &pCVar3->list;
    do {
      lVar44 = lVar39;
      pDVar4 = (Dring *)((long)&pDVar14->next + lVar44);
      pDVar5 = (Dring *)((long)&pDVar15->next + lVar44);
      piVar11[lVar40] = iVar33;
      iVar33 = iVar33 + piVar12[lVar40];
      *(int *)((long)&pDVar14->idx + lVar44) = (int)lVar40;
      *(Dring **)((long)&pDVar14->prev + lVar44) = pDVar41;
      (((Row *)&pDVar41->next)->list).next = pDVar4;
      *(int *)((long)&pDVar15->idx + lVar44) = (int)lVar40;
      *(Dring **)((long)&pDVar15->prev + lVar44) = pDVar42;
      ((Dring *)&pDVar42->next)->next = pDVar5;
      lVar40 = lVar40 + 1;
      iVar25 = this->thedim;
      lVar39 = lVar44 + 0x18;
      pDVar41 = pDVar4;
      pDVar42 = pDVar5;
    } while (lVar40 < iVar25);
    pDVar42 = (Dring *)((long)&pDVar14->next + lVar44);
    pDVar41 = (Dring *)((long)&pDVar15->next + lVar44);
  }
  iVar26 = 0;
  piVar11[iVar25] = 0;
  (this->u).row.max[this->thedim] = 0;
  (this->u).row.used = iVar33;
  (((Row *)&pDVar42->next)->list).next = (Dring *)pUVar2;
  (this->u).row.list.prev = pDVar42;
  ((Dring *)&pDVar41->next)->next = &pCVar3->list;
  (this->u).col.list.prev = pDVar41;
  (this->temp).stage = 0;
  local_480 = &(this->initMaxabs).m_backend;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(local_480,0);
  bVar20 = 0 < this->thedim;
  if (0 < this->thedim) {
    local_488 = (this->initMaxabs).m_backend.data._M_elems + 1;
    lVar39 = 0;
    iVar26 = 0;
    do {
      pSVar16 = local_470[lVar39];
      (this->u).col.start[lVar39] = iVar26;
      uVar34 = 0;
      if (0 < pSVar16->memused) {
        uVar34 = 0;
        lVar44 = 0x78;
        lVar40 = 1;
        do {
          puVar28 = (undefined8 *)((long)(pSVar16->m_elem->val).m_backend.data._M_elems + lVar44);
          puVar36 = (uint *)(puVar28 + -0xf);
          puVar38 = local_a0;
          for (lVar32 = 0x1c; lVar32 != 0; lVar32 = lVar32 + -1) {
            *puVar38 = *puVar36;
            puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
            puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
          }
          local_508.exp = *(int *)(puVar28 + -1);
          local_508.neg = *(bool *)((long)puVar28 + -4);
          local_508._120_8_ = *puVar28;
          pnVar35 = eps;
          pcVar37 = &local_27c;
          for (lVar32 = 0x1c; lVar32 != 0; lVar32 = lVar32 + -1) {
            (pcVar37->data)._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
            pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar35 + ((ulong)bVar45 * -2 + 1) * 4);
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar37 + ((ulong)bVar45 * -2 + 1) * 4);
          }
          local_27c.exp = (eps->m_backend).exp;
          local_27c.neg = (eps->m_backend).neg;
          fVar8 = (eps->m_backend).fpclass;
          iVar17 = (eps->m_backend).prec_elem;
          local_27c.fpclass = fVar8;
          local_27c.prec_elem = iVar17;
          puVar36 = local_a0;
          pcVar37 = &local_508;
          for (lVar32 = 0x1c; lVar32 != 0; lVar32 = lVar32 + -1) {
            (pcVar37->data)._M_elems[0] = *puVar36;
            puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
            pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar45 * -8 + 4);
          }
          if ((local_508.neg == true) &&
             (local_508.data._M_elems[0] != 0 || local_508.fpclass != cpp_dec_float_finite)) {
            local_508.neg = false;
          }
          uVar31 = 0;
          if (fVar8 != cpp_dec_float_NaN && local_508.fpclass != cpp_dec_float_NaN) {
            iVar33 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_508,&local_27c);
            uVar31 = (uint)(0 < iVar33);
          }
          uVar34 = uVar34 + uVar31;
          if (pSVar16->memused <= lVar40) break;
          lVar44 = lVar44 + 0x84;
          lVar40 = lVar40 + 1;
        } while (uVar34 < 2);
      }
      if (uVar34 == 0) {
        this->stat = SINGULAR;
        bVar43 = 0;
      }
      else {
        iVar33 = (int)lVar39;
        if (uVar34 == 1) {
          lVar40 = 0;
          do {
            lVar44 = lVar40;
            pNVar13 = pSVar16->m_elem;
            puVar36 = (uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar44);
            puVar38 = local_110;
            for (lVar40 = 0x1c; lVar40 != 0; lVar40 = lVar40 + -1) {
              *puVar38 = *puVar36;
              puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
              puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
            }
            local_508.exp = *(int *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar44);
            local_508.neg = *(bool *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar44 + 4);
            local_508._120_8_ =
                 *(undefined8 *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar44 + 8);
            pnVar35 = eps;
            pcVar37 = &local_1fc;
            for (lVar40 = 0x1c; lVar40 != 0; lVar40 = lVar40 + -1) {
              (pcVar37->data)._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
              pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar35 + ((ulong)bVar45 * -2 + 1) * 4);
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar45 * -8 + 4);
            }
            local_1fc.exp = (eps->m_backend).exp;
            local_1fc.neg = (eps->m_backend).neg;
            fVar9 = (eps->m_backend).fpclass;
            iVar18 = (eps->m_backend).prec_elem;
            local_1fc.fpclass = fVar9;
            local_1fc.prec_elem = iVar18;
            puVar36 = local_110;
            pcVar37 = &local_508;
            for (lVar40 = 0x1c; lVar40 != 0; lVar40 = lVar40 + -1) {
              (pcVar37->data)._M_elems[0] = *puVar36;
              puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
              pcVar37 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar37 + (ulong)bVar45 * -8 + 4);
            }
            if ((local_508.neg == true) &&
               (local_508.data._M_elems[0] != 0 || local_508.fpclass != cpp_dec_float_finite)) {
              local_508.neg = false;
            }
            if ((local_508.fpclass == cpp_dec_float_NaN) || (fVar9 == cpp_dec_float_NaN)) break;
            iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_508,&local_1fc);
            lVar40 = lVar44 + 0x84;
          } while (iVar25 < 1);
          iVar25 = (this->row).perm[*(int *)((long)(&pSVar16->m_elem->val + 1) + lVar44)];
          bVar21 = (byte)((uint)iVar25 >> 0x18);
          bVar43 = bVar21 >> 7;
          if (iVar25 < 0) {
            puVar29 = (uint *)((long)(pSVar16->m_elem->val).m_backend.data._M_elems + lVar44);
            uVar34 = *puVar29;
            puVar36 = puVar29 + 1;
            puVar38 = (uint *)local_3e8;
            for (lVar40 = 0x1b; lVar40 != 0; lVar40 = lVar40 + -1) {
              *puVar38 = *puVar36;
              puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
              puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
            }
            uVar31 = puVar29[0x1c];
            bVar43 = (byte)puVar29[0x1d];
            fVar6 = puVar29[0x1e];
            uVar7 = puVar29[0x1f];
            uVar22 = *(undefined8 *)(puVar29 + 0x1e);
            puVar36 = (uint *)local_3e8;
            puVar38 = local_508.data._M_elems + 1;
            for (lVar40 = 0x1b; lVar40 != 0; lVar40 = lVar40 + -1) {
              *puVar38 = *puVar36;
              puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
              puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
            }
            local_508.neg = (bool)bVar43;
            if ((bVar43 == 1) && (fVar6 != cpp_dec_float_finite || uVar34 != 0)) {
              local_508.neg = false;
            }
            local_508.data._M_elems[0] = uVar34;
            local_508.exp = uVar31;
            local_508._120_8_ = uVar22;
            if (((fVar6 != cpp_dec_float_NaN) &&
                ((this->initMaxabs).m_backend.fpclass != cpp_dec_float_NaN)) &&
               (iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_508,local_480), 0 < iVar25)) {
              bVar24 = bVar43;
              if (bVar43 != 0) {
                bVar24 = (fVar6 != cpp_dec_float_finite || uVar34 != 0) ^ bVar43;
              }
              (this->initMaxabs).m_backend.data._M_elems[0] = uVar34;
              puVar36 = (uint *)local_3e8;
              puVar38 = local_488;
              for (lVar40 = 0x1b; lVar40 != 0; lVar40 = lVar40 + -1) {
                *puVar38 = *puVar36;
                puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
                puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
              }
              (this->initMaxabs).m_backend.exp = uVar31;
              (this->initMaxabs).m_backend.neg = (bool)bVar24;
              (this->initMaxabs).m_backend.fpclass = fVar6;
              (this->initMaxabs).m_backend.prec_elem = uVar7;
            }
            iVar25 = (this->temp).stage;
            p_row = *(int *)((long)(&pSVar16->m_elem->val + 1) + lVar44);
            local_37c.m_backend.data._M_elems[0] = uVar34;
            puVar36 = (uint *)local_3e8;
            puVar38 = local_37c.m_backend.data._M_elems + 1;
            for (lVar40 = 0x1b; lVar40 != 0; lVar40 = lVar40 + -1) {
              *puVar38 = *puVar36;
              puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
              puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
            }
            local_37c.m_backend.exp = uVar31;
            local_37c.m_backend.neg = (bool)bVar43;
            local_37c.m_backend.fpclass = fVar6;
            local_37c.m_backend.prec_elem = uVar7;
            setPivot(this,iVar25,iVar33,p_row,&local_37c);
            local_478[(this->temp).stage] = iVar33;
            piVar11 = &(this->temp).stage;
            *piVar11 = *piVar11 + 1;
            (this->u).col.max[lVar39] = 0;
            (this->u).col.len[lVar39] = 0;
            (this->temp).s_cact[lVar39] = 0;
            bVar43 = bVar21 >> 7;
          }
          else {
            this->stat = SINGULAR;
          }
        }
        else {
          if (pSVar16->memused < 1) {
            local_51c = 0;
          }
          else {
            lVar40 = 0;
            lVar44 = 0;
            local_51c = 0;
            do {
              puVar29 = (uint *)((long)(pSVar16->m_elem->val).m_backend.data._M_elems + lVar40);
              uVar34 = *puVar29;
              puVar36 = puVar29 + 1;
              puVar38 = (uint *)local_3e8;
              for (lVar32 = 0x1b; lVar32 != 0; lVar32 = lVar32 + -1) {
                *puVar38 = *puVar36;
                puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
                puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
              }
              uVar31 = puVar29[0x1c];
              bVar43 = (byte)puVar29[0x1d];
              pfVar1 = puVar29 + 0x1e;
              fVar6 = *pfVar1;
              uVar7 = puVar29[0x1f];
              uVar23 = *(undefined8 *)pfVar1;
              uVar22 = *(undefined8 *)pfVar1;
              puVar36 = puVar29 + 1;
              puVar38 = local_17c;
              for (lVar32 = 0x1b; lVar32 != 0; lVar32 = lVar32 + -1) {
                *puVar38 = *puVar36;
                puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
                puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
              }
              pnVar35 = eps;
              pcVar37 = &local_2fc;
              for (lVar32 = 0x1c; lVar32 != 0; lVar32 = lVar32 + -1) {
                (pcVar37->data)._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
                pnVar35 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar35 + ((ulong)bVar45 * -2 + 1) * 4);
                pcVar37 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar37 + ((ulong)bVar45 * -2 + 1) * 4);
              }
              local_2fc.exp = (eps->m_backend).exp;
              local_2fc.neg = (eps->m_backend).neg;
              fVar10 = (eps->m_backend).fpclass;
              iVar19 = (eps->m_backend).prec_elem;
              local_2fc.fpclass = fVar10;
              local_2fc.prec_elem = iVar19;
              puVar36 = local_17c;
              puVar38 = local_508.data._M_elems + 1;
              for (lVar32 = 0x1b; lVar32 != 0; lVar32 = lVar32 + -1) {
                *puVar38 = *puVar36;
                puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
                puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
              }
              local_508.neg = (bool)bVar43;
              if (((bool)bVar43 == true) && (fVar6 != cpp_dec_float_finite || uVar34 != 0)) {
                local_508.neg = false;
              }
              local_508.data._M_elems[0] = uVar34;
              if ((fVar10 != cpp_dec_float_NaN && fVar6 != cpp_dec_float_NaN) &&
                 (local_508.exp = uVar31, local_508._120_8_ = uVar22,
                 iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_508,&local_2fc), 0 < iVar25)) {
                iVar25 = *(int *)((long)(&pSVar16->m_elem->val + 1) + lVar40);
                (this->u).col.idx[iVar26] = iVar25;
                lVar32 = (long)(this->u).row.len[iVar25] + (long)(this->u).row.start[iVar25];
                (this->u).row.idx[lVar32] = iVar33;
                pnVar30 = (this->u).row.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar32;
                (pnVar30->m_backend).data._M_elems[0] = uVar34;
                puVar36 = (uint *)local_3e8;
                puVar38 = (uint *)((long)(pnVar30->m_backend).data._M_elems + 4);
                for (lVar32 = 0x1b; lVar32 != 0; lVar32 = lVar32 + -1) {
                  *puVar38 = *puVar36;
                  puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
                  puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
                }
                (pnVar30->m_backend).exp = uVar31;
                (pnVar30->m_backend).neg = (bool)bVar43;
                (pnVar30->m_backend).fpclass = fVar6;
                (pnVar30->m_backend).prec_elem = uVar7;
                piVar11 = (this->u).row.len + iVar25;
                *piVar11 = *piVar11 + 1;
                puVar36 = (uint *)local_3e8;
                puVar38 = local_508.data._M_elems + 1;
                for (lVar32 = 0x1b; lVar32 != 0; lVar32 = lVar32 + -1) {
                  *puVar38 = *puVar36;
                  puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
                  puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
                }
                local_508.neg = (bool)bVar43;
                if (((bool)bVar43 != false) && (fVar6 != cpp_dec_float_finite || uVar34 != 0)) {
                  local_508.neg = (bool)(bVar43 ^ 1);
                }
                local_508.data._M_elems[0] = uVar34;
                if (((fVar6 != cpp_dec_float_NaN) &&
                    ((this->initMaxabs).m_backend.fpclass != cpp_dec_float_NaN)) &&
                   (local_508.exp = uVar31, local_508._120_8_ = uVar23,
                   iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      (&local_508,local_480), 0 < iVar25)) {
                  if ((bool)bVar43 != false) {
                    bVar43 = bVar43 ^ (fVar6 != cpp_dec_float_finite || uVar34 != 0);
                  }
                  (this->initMaxabs).m_backend.data._M_elems[0] = uVar34;
                  puVar36 = (uint *)local_3e8;
                  puVar38 = local_488;
                  for (lVar32 = 0x1b; lVar32 != 0; lVar32 = lVar32 + -1) {
                    *puVar38 = *puVar36;
                    puVar36 = puVar36 + (ulong)bVar45 * -2 + 1;
                    puVar38 = puVar38 + (ulong)bVar45 * -2 + 1;
                  }
                  (this->initMaxabs).m_backend.exp = uVar31;
                  (this->initMaxabs).m_backend.neg = (bool)bVar43;
                  (this->initMaxabs).m_backend.fpclass = fVar6;
                  (this->initMaxabs).m_backend.prec_elem = uVar7;
                }
                iVar26 = iVar26 + 1;
                local_51c = local_51c + 1;
              }
              lVar44 = lVar44 + 1;
              lVar40 = lVar40 + 0x84;
            } while (lVar44 < pSVar16->memused);
          }
          (this->u).col.max[lVar39] = local_51c;
          (this->u).col.len[lVar39] = local_51c;
          (this->temp).s_cact[lVar39] = local_51c;
          bVar43 = 1;
        }
      }
      if (bVar43 == 0) break;
      lVar39 = lVar39 + 1;
      bVar20 = lVar39 < this->thedim;
    } while (lVar39 < this->thedim);
  }
  if (!bVar20) {
    (this->u).col.used = iVar26;
  }
  return;
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}